

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.cpp
# Opt level: O1

void __thiscall
sjtu::UserManager::query_order(UserManager *this,OrderManager *order_manager,int argc,string *argv)

{
  pointer pcVar1;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  ostream *poVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  char *__s;
  pair<long,_bool> pVar9;
  string uname;
  char local_89;
  ulong local_88;
  long *local_80;
  long local_78;
  long local_70 [2];
  long local_60;
  char local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_50 = local_40;
  pcVar1 = argv[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + argv[1]._M_string_length);
  this_00 = this->UserBpTree;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_50,local_48 + (long)local_50);
  if (local_78 == 0) {
    local_88 = 0;
  }
  else {
    lVar7 = 0;
    lVar6 = 0;
    local_88 = 0;
    do {
      uVar8 = (ulong)((int)*(char *)((long)local_80 + lVar7) + 0x100);
      lVar6 = (long)(lVar6 * 0x239 + uVar8) % 0x3b800001;
      local_88 = (long)(local_88 * 0x301 + uVar8) % 0x3b9aca07;
      lVar7 = lVar7 + 1;
    } while (local_78 != lVar7);
    local_88 = lVar6 << 0x20 | local_88;
  }
  pVar9 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (this_00,&local_88);
  local_60 = pVar9.first;
  local_58 = pVar9.second;
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_58 == '\0') {
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  else {
    iVar2 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                      (this->UserFile,&local_60);
    lVar6 = CONCAT44(extraout_var,iVar2);
    if (*(uint *)(lVar6 + 0x6c) == this->online_flag) {
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,*(int *)(lVar6 + 0x80));
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      local_88 = *(ulong *)(lVar6 + 0x70);
      if (local_88 != 0xffffffffffffffff) {
        do {
          iVar2 = (*(order_manager->OrderFile->
                    super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
                    _vptr_FileManager_Base[2])(order_manager->OrderFile,&local_88);
          lVar6 = CONCAT44(extraout_var_00,iVar2);
          local_89 = '[';
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,&local_89,1);
          __s = "refunded";
          if (*(int *)(lVar6 + 0xa8) == 1) {
            __s = "pending";
          }
          if (*(int *)(lVar6 + 0xa8) == 0) {
            __s = "success";
          }
          sVar5 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
          sVar5 = strlen((char *)(lVar6 + 0x15));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)(lVar6 + 0x15),sVar5);
          local_89 = ' ';
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_89,1);
          sVar5 = strlen((char *)(lVar6 + 0x4c));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)(lVar6 + 0x4c),sVar5);
          local_89 = ' ';
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_89,1);
          poVar4 = operator<<(poVar4,(timeType *)(lVar6 + 0x2c));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
          sVar5 = strlen((char *)(lVar6 + 0x75));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)(lVar6 + 0x75),sVar5);
          local_89 = ' ';
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_89,1);
          poVar4 = operator<<(poVar4,(timeType *)(lVar6 + 0x3c));
          local_89 = ' ';
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_89,1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,*(int *)(lVar6 + 0xa4));
          local_89 = ' ';
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_89,1);
          plVar3 = (long *)std::ostream::operator<<((ostream *)poVar4,*(int *)(lVar6 + 0xa0));
          std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
          std::ostream::put((char)plVar3);
          std::ostream::flush();
          local_88 = *(ulong *)(lVar6 + 0xb8);
        } while (local_88 != 0xffffffffffffffff);
      }
    }
    else {
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
    }
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void UserManager::query_order(OrderManager *order_manager, int argc, std::string *argv) {
            std::string uname = argv[1];
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(uname));
            if (tmp.second == false) std::cout << -1 << std::endl;
            else {
                userType *cur = UserFile->read(tmp.first);
                if (cur->is_online != online_flag) std::cout << -1 << std::endl;
                else {
                    std::cout << cur->order_count << std::endl;
                    locType tmpticket = cur->head;
                    while (tmpticket != -1) {
                        auto ret = order_manager->OrderFile->read(tmpticket);
                        std::cout << '[' << (ret -> first.status ? (ret -> first.status == pending ? "pending" : "refunded") : "success" ) << "] " << ret->first.trainID << ' ' << ret->first.station[0] << ' ' << ret->first.date[0] << " -> " << ret->first.station[1] << ' ' << ret->first.date[1] << ' ' << ret->first.price << ' ' << ret->first.num << std::endl;
                        tmpticket = ret -> second;
                    }
                }
            }
        }